

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O2

_Bool XCore_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  cs_detail *__s;
  long lVar4;
  DecodeStatus DVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  byte *pbVar8;
  byte *pbVar9;
  void *pvVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint local_58;
  uint local_50;
  uint local_4c;
  uint16_t *local_48;
  uint *local_40;
  size_t local_38;
  
  if (1 < code_len) {
    uVar3 = *(ushort *)code;
    __s = MI->flat_insn->detail;
    local_48 = size;
    local_40 = (uint *)code;
    local_38 = code_len;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0xdc);
    }
    uVar16 = 0;
    pbVar9 = "\x01\v\x05\x02";
LAB_0024070f:
    pbVar8 = pbVar9;
    if (*pbVar8 - 1 < 6) {
      local_58 = (uint)uVar3;
      switch((uint)*pbVar8) {
      case 1:
        bVar2 = pbVar8[2];
        uVar16 = ~(-1 << (bVar2 & 0x1f)) << (pbVar8[1] & 0x1f);
        local_50 = (uint)bVar2;
        if (bVar2 == 0x10) {
          uVar16 = 0xffff;
        }
        uVar16 = (uVar16 & local_58) >> (pbVar8[1] & 0x1f);
        pbVar9 = pbVar8 + 3;
        goto LAB_0024070f;
      case 2:
        uVar6 = decodeULEB128(pbVar8 + 1,&local_50);
        pbVar9 = pbVar8 + (ulong)local_50 + 3;
        if (((uint)uVar6 & 0xffff) == uVar16) goto LAB_0024070f;
        lVar4 = (ulong)local_50 + 1;
        break;
      case 3:
        bVar2 = pbVar8[1];
        bVar1 = pbVar8[2];
        uVar13 = ~(-1 << (bVar1 & 0x1f)) << (bVar2 & 0x1f);
        local_50 = (uint)bVar1;
        if (bVar1 == 0x10) {
          uVar13 = 0xffff;
        }
        uVar6 = decodeULEB128(pbVar8 + 3,&local_50);
        pbVar9 = pbVar8 + (ulong)local_50 + 5;
        if ((uVar13 & local_58) >> (bVar2 & 0x1f) == (uint)uVar6) goto LAB_0024070f;
        lVar4 = (ulong)local_50 + 3;
        break;
      case 4:
        decodeULEB128(pbVar8 + 1,&local_50);
        pbVar9 = pbVar8 + (ulong)local_50 + 3;
        goto LAB_0024070f;
      case 5:
        uVar6 = decodeULEB128(pbVar8 + 1,&local_50);
        uVar7 = decodeULEB128(pbVar8 + (ulong)local_50 + 1,&local_50);
        MCInst_setOpcode(MI,(uint)uVar6);
        uVar16 = (int)uVar7 - 1;
        if (0x23 < uVar16) goto LAB_00240d6c;
        pvVar10 = (void *)((long)&switchD_00240879::switchdataD_0053dcc8 +
                          (long)(int)(&switchD_00240879::switchdataD_0053dcc8)[uVar16]);
        uVar14 = (uint)uVar3;
        uVar13 = (uint)uVar3;
        uVar16 = (uint)uVar3;
        switch((int)uVar7) {
        case 1:
          DVar5 = DecodeGRRegsRegisterClass(MI,local_58 & 0xf,(uint64_t)info,pvVar10);
          break;
        case 2:
          DVar5 = Decode2RInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 3:
          DVar5 = Decode2RUSInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 4:
          DVar5 = DecodeR2RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 5:
          DVar5 = Decode3RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 6:
          DVar5 = Decode2RImmInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 7:
          DVar5 = Decode2RSrcDstInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 8:
          DVar5 = DecodeRUSSrcDstBitpInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 9:
          DVar5 = DecodeRUSInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 10:
          DVar5 = DecodeRRegsRegisterClass(MI,uVar3 >> 6 & 0xf,(uint64_t)info,pvVar10);
          goto LAB_00240ae2;
        case 0xb:
          goto switchD_00240879_caseD_b;
        case 0xc:
          DVar5 = DecodeGRRegsRegisterClass(MI,uVar3 >> 6 & 0xf,(uint64_t)info,pvVar10);
LAB_00240ae2:
          if (DVar5 != MCDisassembler_Fail) {
switchD_00240879_caseD_b:
            uVar15 = (ulong)(uVar16 & 0x3f);
LAB_00240d62:
            MCOperand_CreateImm0(MI,uVar15);
            goto LAB_00240d6c;
          }
          goto LAB_00240b93;
        case 0xd:
          goto switchD_00240879_caseD_d;
        case 0xe:
          DVar5 = DecodeGRRegsRegisterClass(MI,uVar3 >> 6 & 0xf,(uint64_t)info,pvVar10);
          if (DVar5 != MCDisassembler_Fail) {
switchD_00240879_caseD_d:
            uVar15 = (ulong)(uVar16 & 0x3f);
LAB_00240b2d:
            uVar15 = -uVar15;
            goto LAB_00240d62;
          }
          goto LAB_00240b93;
        case 0xf:
          DVar5 = DecodeRUSBitpInstruction(MI,uVar14,(uint64_t)info,pvVar10);
          break;
        case 0x10:
          DVar5 = Decode2RUSBitpInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 0x11:
          DVar5 = Decode3RImmInstruction(MI,uVar14,(uint64_t)info,pvVar10);
          break;
        case 0x12:
          uVar15 = (ulong)(uVar16 & 0x3ff);
          goto LAB_00240d62;
        case 0x13:
          uVar15 = (ulong)(uVar16 & 0x3ff);
          goto LAB_00240b2d;
        case 0x14:
          DVar5 = DecodeL2RInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x15:
          DVar5 = DecodeL3RInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x16:
          DVar5 = DecodeL4RSrcDstInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x17:
          DVar5 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x18:
          DVar5 = DecodeL5RInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x19:
          DVar5 = DecodeL6RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 0x1a:
          DVar5 = DecodeLR2RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 0x1b:
          DVar5 = DecodeRRegsRegisterClass(MI,0,(uint64_t)info,pvVar10);
          goto LAB_00240d4f;
        case 0x1c:
          goto switchD_00240879_caseD_1c;
        case 0x1d:
          DVar5 = DecodeGRRegsRegisterClass(MI,0,(uint64_t)info,pvVar10);
LAB_00240d4f:
          if (DVar5 != MCDisassembler_Fail) {
switchD_00240879_caseD_1c:
            uVar14 = uVar14 << 6;
LAB_00240d5f:
            uVar15 = (ulong)(uVar14 & 0xffff);
            goto LAB_00240d62;
          }
          goto LAB_00240b93;
        case 0x1e:
          goto switchD_00240879_caseD_1e;
        case 0x1f:
          DVar5 = DecodeGRRegsRegisterClass(MI,0,(uint64_t)info,pvVar10);
          if (DVar5 != MCDisassembler_Fail) {
switchD_00240879_caseD_1e:
            uVar14 = uVar16 << 6;
LAB_00240b2a:
            uVar15 = (ulong)(uVar14 & 0xffff);
            goto LAB_00240b2d;
          }
          goto LAB_00240b93;
        case 0x20:
          DVar5 = DecodeL2RUSBitpInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x21:
          DVar5 = DecodeL2RUSInstruction(MI,uVar16,(uint64_t)info,pvVar10);
          break;
        case 0x22:
          DVar5 = DecodeL3RSrcDstInstruction(MI,uVar13,(uint64_t)info,pvVar10);
          break;
        case 0x23:
          uVar14 = uVar14 << 10;
          goto LAB_00240d5f;
        case 0x24:
          uVar14 = uVar14 << 10;
          goto LAB_00240b2a;
        }
        if (DVar5 != MCDisassembler_Fail) {
LAB_00240d6c:
          *local_48 = 2;
          goto LAB_002410ae;
        }
        goto LAB_00240b93;
      case 6:
        goto switchD_00240727_caseD_6;
      }
      pbVar9 = pbVar9 + *(ushort *)(pbVar8 + lVar4);
      goto LAB_0024070f;
    }
LAB_00240b93:
    uVar16 = 0;
    if (3 < local_38) {
      uVar13 = *local_40;
      puVar12 = "\x01\x1b\x05\x02";
LAB_00240bbc:
      puVar11 = puVar12;
      switch(*puVar11) {
      case '\x01':
        bVar2 = puVar11[2];
        local_4c = (uint)bVar2;
        uVar16 = ~(-1 << (bVar2 & 0x1f)) << (puVar11[1] & 0x1f);
        if (bVar2 == 0x20) {
          uVar16 = 0xffffffff;
        }
        uVar16 = (uVar16 & uVar13) >> (puVar11[1] & 0x1f);
        puVar12 = puVar11 + 3;
        goto LAB_00240bbc;
      case '\x02':
        uVar6 = decodeULEB128(puVar11 + 1,&local_4c);
        puVar12 = puVar11 + (ulong)local_4c + 3;
        if (uVar16 == (uint)uVar6) goto LAB_00240bbc;
        lVar4 = (ulong)local_4c + 1;
        break;
      case '\x03':
        bVar2 = puVar11[1];
        bVar1 = puVar11[2];
        local_4c = (uint)bVar1;
        uVar14 = ~(-1 << (bVar1 & 0x1f)) << (bVar2 & 0x1f);
        if (bVar1 == 0x20) {
          uVar14 = 0xffffffff;
        }
        uVar6 = decodeULEB128(puVar11 + 3,&local_4c);
        puVar12 = puVar11 + (ulong)local_4c + 5;
        if ((uVar14 & uVar13) >> (bVar2 & 0x1f) == (uint)uVar6) goto LAB_00240bbc;
        lVar4 = (ulong)local_4c + 3;
        break;
      case '\x04':
        decodeULEB128(puVar11 + 1,&local_4c);
        puVar12 = puVar11 + (ulong)local_4c + 3;
        goto LAB_00240bbc;
      case '\x05':
        goto switchD_00240bd5_caseD_5;
      case '\x06':
        goto switchD_00240bd5_caseD_6;
      default:
        goto switchD_00240bd5_default;
      }
      puVar12 = puVar12 + *(ushort *)(puVar11 + lVar4);
      goto LAB_00240bbc;
    }
    goto LAB_002410b1;
  }
  goto switchD_00240bd5_default;
switchD_00240727_caseD_6:
  decodeULEB128(pbVar8 + 1,&local_50);
  uVar15 = (ulong)local_50;
  decodeULEB128(pbVar8 + uVar15 + 1,&local_50);
  pbVar9 = pbVar8 + uVar15 + 1 + local_50;
  goto LAB_0024070f;
switchD_00240bd5_caseD_6:
  decodeULEB128(puVar11 + 1,&local_4c);
  uVar15 = (ulong)local_4c;
  decodeULEB128(puVar11 + uVar15 + 1,&local_4c);
  puVar12 = puVar11 + uVar15 + 1 + local_4c;
  goto LAB_00240bbc;
switchD_00240d21_caseD_1e:
  uVar16 = (uVar13 & 0x3ff) << 6;
  uVar13 = uVar13 >> 0x10 & 0x3f;
LAB_00241006:
  uVar15 = (ulong)(uVar13 | uVar16);
LAB_00241009:
  uVar15 = -uVar15;
LAB_00241097:
  MCOperand_CreateImm0(MI,uVar15);
  goto LAB_002410a4;
switchD_00240bd5_caseD_5:
  uVar6 = decodeULEB128(puVar11 + 1,&local_4c);
  uVar7 = decodeULEB128(puVar11 + (ulong)local_4c + 1,&local_4c);
  MCInst_setOpcode(MI,(uint)uVar6);
  uVar16 = (int)uVar7 - 1;
  if (0x23 < uVar16) goto LAB_002410a4;
  pvVar10 = (void *)((long)&switchD_00240d21::switchdataD_0053dd70 +
                    (long)(int)(&switchD_00240d21::switchdataD_0053dd70)[uVar16]);
  switch((int)uVar7) {
  case 1:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar13 & 0xf,(uint64_t)info,pvVar10);
    break;
  case 2:
    DVar5 = Decode2RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 3:
    DVar5 = Decode2RUSInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 4:
    DVar5 = DecodeR2RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 5:
    DVar5 = Decode3RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 6:
    DVar5 = Decode2RImmInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 7:
    DVar5 = Decode2RSrcDstInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 8:
    DVar5 = DecodeRUSSrcDstBitpInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 9:
    DVar5 = DecodeRUSInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 10:
    DVar5 = DecodeRRegsRegisterClass(MI,uVar13 >> 6 & 0xf,(uint64_t)info,pvVar10);
    goto LAB_00240fb1;
  case 0xb:
    goto switchD_00240d21_caseD_b;
  case 0xc:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar13 >> 6 & 0xf,(uint64_t)info,pvVar10);
LAB_00240fb1:
    if (DVar5 != MCDisassembler_Fail) {
switchD_00240d21_caseD_b:
      uVar15 = (ulong)(uVar13 & 0x3f);
      goto LAB_00241097;
    }
    goto switchD_00240bd5_default;
  case 0xd:
switchD_00240d21_caseD_d:
    uVar15 = (ulong)(uVar13 & 0x3f);
    goto LAB_00241009;
  case 0xe:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar13 >> 6 & 0xf,(uint64_t)info,pvVar10);
    if (DVar5 != MCDisassembler_Fail) goto switchD_00240d21_caseD_d;
    goto switchD_00240bd5_default;
  case 0xf:
    DVar5 = DecodeRUSBitpInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x10:
    DVar5 = Decode2RUSBitpInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x11:
    DVar5 = Decode3RImmInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x12:
    uVar15 = (ulong)(uVar13 & 0x3ff);
    goto LAB_00241097;
  case 0x13:
    uVar15 = (ulong)(uVar13 & 0x3ff);
    goto LAB_00241009;
  case 0x14:
    DVar5 = DecodeL2RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x15:
    DVar5 = DecodeL3RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x16:
    DVar5 = DecodeL4RSrcDstInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x17:
    DVar5 = DecodeL4RSrcDstSrcDstInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x18:
    DVar5 = DecodeL5RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x19:
    DVar5 = DecodeL6RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x1a:
    DVar5 = DecodeLR2RInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x1b:
    DVar5 = DecodeRRegsRegisterClass(MI,uVar13 >> 0x16 & 0xf,(uint64_t)info,pvVar10);
    goto LAB_0024107f;
  case 0x1c:
    goto switchD_00240d21_caseD_1c;
  case 0x1d:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar13 >> 0x16 & 0xf,(uint64_t)info,pvVar10);
LAB_0024107f:
    if (DVar5 != MCDisassembler_Fail) {
switchD_00240d21_caseD_1c:
      uVar16 = (uVar13 & 0x3ff) << 6;
      uVar13 = uVar13 >> 0x10 & 0x3f;
LAB_00241094:
      uVar15 = (ulong)(uVar13 | uVar16);
      goto LAB_00241097;
    }
    goto switchD_00240bd5_default;
  case 0x1e:
    goto switchD_00240d21_caseD_1e;
  case 0x1f:
    DVar5 = DecodeGRRegsRegisterClass(MI,uVar13 >> 0x16 & 0xf,(uint64_t)info,pvVar10);
    if (DVar5 == MCDisassembler_Fail) goto switchD_00240bd5_default;
    goto switchD_00240d21_caseD_1e;
  case 0x20:
    DVar5 = DecodeL2RUSBitpInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x21:
    DVar5 = DecodeL2RUSInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x22:
    DVar5 = DecodeL3RSrcDstInstruction(MI,uVar13,(uint64_t)info,pvVar10);
    break;
  case 0x23:
    uVar16 = (uVar13 & 0x3ff) << 10;
    uVar13 = uVar13 >> 0x10 & 0x3ff;
    goto LAB_00241094;
  case 0x24:
    uVar16 = (uVar13 & 0x3ff) << 10;
    uVar13 = uVar13 >> 0x10 & 0x3ff;
    goto LAB_00241006;
  }
  if (DVar5 == MCDisassembler_Fail) {
switchD_00240bd5_default:
    uVar16 = 0;
  }
  else {
LAB_002410a4:
    *local_48 = 4;
LAB_002410ae:
    uVar16 = 1;
  }
LAB_002410b1:
  return SUB41(uVar16,0);
}

Assistant:

bool XCore_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint16_t insn16;
	uint32_t insn32;
	DecodeStatus Result;

	if (!readInstruction16(code, code_len, &insn16)) {
		return false;
	}

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, xcore)+sizeof(cs_xcore));
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_2(DecoderTable16, MI, insn16, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 2;
		return true;
	}

	if (!readInstruction32(code, code_len, &insn32)) {
		return false;
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction_4(DecoderTable32, MI, insn32, address, info, 0);
	if (Result != MCDisassembler_Fail) {
		*size = 4;
		return true;
	}

	return false;
}